

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O2

void __thiscall Fl_Menu_Button_Type::ideal_size(Fl_Menu_Button_Type *this,int *w,int *h)

{
  int iVar1;
  int iVar2;
  
  Fl_Widget_Type::ideal_size((Fl_Widget_Type *)this,w,h);
  iVar1 = (((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o)->label_).size;
  *w = iVar1 + *w + (iVar1 * 2 - 6U & 0xfffffffc) + -4;
  iVar2 = *h - *h % 5;
  iVar1 = 0xf;
  if (0xf < iVar2) {
    iVar1 = iVar2;
  }
  *h = iVar1;
  if (*w < iVar1 + 0xf) {
    *w = iVar1 + 0xf;
  }
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Widget_Type::ideal_size(w, h);
    w += 2 * ((o->labelsize() - 3) & ~1) + o->labelsize() - 4;
    h = (h / 5) * 5;
    if (h < 15) h = 15;
    if (w < (15 + h)) w = 15 + h;
  }